

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall MultiObjTestSolver<0>::~MultiObjTestSolver(MultiObjTestSolver<0> *this)

{
  MultiObjTestSolver<0> *in_stack_00000010;
  
  ~MultiObjTestSolver(in_stack_00000010);
  return;
}

Assistant:

explicit MultiObjTestSolver()
    : mp::SolverImpl<MultiObjMockProblemBuilder>("", 0, 0, FLAGS), builder(0) {}